

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLExportVisitor::visit_(IDLExportVisitor *this,Container *type)

{
  map<std::__cxx11::string,Typelib::Type_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
  *this_00;
  bool bVar1;
  Type *pTVar2;
  ulong uVar3;
  ostream *poVar4;
  Container *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Container_*>
  local_218;
  allocator local_1e9;
  string local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  undefined1 local_188 [8];
  string typedef_name;
  string local_160;
  undefined1 local_140 [8];
  string element_name;
  string local_118;
  string local_f8;
  allocator local_c1;
  string local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_60 [8];
  string target_namespace;
  Container *type_local;
  IDLExportVisitor *this_local;
  
  Typelib::Type::getName_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&target_namespace.field_2 + 8),"/std/string");
  std::__cxx11::string::~string((string *)(target_namespace.field_2._M_local_buf + 8));
  if (!bVar1) {
    pTVar2 = (Type *)Typelib::Indirect::getIndirection();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
    getIDLBase(&local_a0,this,pTVar2,&local_c0);
    std::__cxx11::string::string((string *)local_60,(string *)&local_a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"/",(allocator *)(element_name.field_2._M_local_buf + 0xf));
      getIDLAbsoluteNamespace(&local_f8,&local_118,this->m_exporter);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)(element_name.field_2._M_local_buf + 0xf))
      ;
    }
    setTargetNamespace(this,(string *)local_60);
    pTVar2 = (Type *)Typelib::Indirect::getIndirection();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_160,"",(allocator *)(typedef_name.field_2._M_local_buf + 0xf));
    getIDLAbsolute((string *)local_140,this,pTVar2,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)(typedef_name.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
    getIDLBase(&local_1c8,this,(Type *)type,&local_1e8);
    std::__cxx11::string::string((string *)local_188,(string *)&local_1c8.second);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    boost::algorithm::replace_all<std::__cxx11::string,char[3],char[2]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
               (char (*) [3])"::",(char (*) [2])"_");
    poVar4 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
    poVar4 = std::operator<<(poVar4,"typedef sequence<");
    poVar4 = std::operator<<(poVar4,(string *)local_140);
    poVar4 = std::operator<<(poVar4,"> ");
    poVar4 = std::operator<<(poVar4,(string *)local_188);
    std::operator<<(poVar4,";\n");
    this_00 = (map<std::__cxx11::string,Typelib::Type_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
               *)this->m_exported_typedefs;
    Typelib::Indirect::getIndirection();
    Typelib::Type::getNamespace_abi_cxx11_();
    std::operator+(&local_238,&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    local_260 = type;
    std::make_pair<std::__cxx11::string,Typelib::Container_const*>(&local_218,&local_238,&local_260)
    ;
    std::
    map<std::__cxx11::string,Typelib::Type_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
    ::insert<std::pair<std::__cxx11::string,Typelib::Container_const*>>(this_00,&local_218);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Container_*>
    ::~pair(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_60);
  }
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
            return true;

        // sequence<> can be used as-is, but in order to be as cross-ORB
        // compatible as possible we generate sequence typedefs and use them in
        // the compounds. Emit the sequence right now.
        string target_namespace  = getIDLBase(type.getIndirection()).first;
        // We never emit sequences into the main namespace, even if their
        // element is a builtin
        if (target_namespace.empty())
            target_namespace = getIDLAbsoluteNamespace("/", m_exporter);
        setTargetNamespace(target_namespace);

        std::string element_name = getIDLAbsolute(type.getIndirection());
        std::string typedef_name = getIDLBase(type).second;
        boost::replace_all(typedef_name, "::", "_");
        m_stream << m_indent << "typedef sequence<" << element_name << "> " << typedef_name << ";\n";
        m_exported_typedefs.insert(make_pair(type.getIndirection().getNamespace() + typedef_name, &type));

        return true;
    }